

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderPackingFunctionTests.cpp
# Opt level: O3

TestInstance * __thiscall
vkt::shaderexecutor::PackSnorm4x8Case::createInstance(PackSnorm4x8Case *this,Context *ctx)

{
  Precision PVar1;
  ShaderPackingFunctionTestInstance *this_00;
  
  this_00 = (ShaderPackingFunctionTestInstance *)operator_new(0xb0);
  PVar1 = this->m_precision;
  ShaderPackingFunctionTestInstance::ShaderPackingFunctionTestInstance
            (this_00,ctx,(this->super_ShaderPackingFunctionCase).m_shaderType,
             &(this->super_ShaderPackingFunctionCase).m_spec,
             (this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
             m_name._M_dataplus._M_p);
  (this_00->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__ShaderPackingFunctionTestInstance_00d3b110;
  *(Precision *)&this_00[1].super_TestInstance._vptr_TestInstance = PVar1;
  return &this_00->super_TestInstance;
}

Assistant:

TestInstance* createInstance (Context& ctx) const
	{
		return new PackSnorm4x8CaseInstance(ctx, m_shaderType, m_spec, m_precision, getName());
	}